

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_socket_send(ENetSocket socket,ENetAddress *address,ENetBuffer *buffers,size_t bufferCount)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined2 local_7c;
  uint16_t local_7a;
  int sentLength;
  sockaddr_in6 sin;
  msghdr msgHdr;
  size_t bufferCount_local;
  ENetBuffer *buffers_local;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  memset((void *)((long)&sin.sin6_addr.__in6_u + 0xc),0,0x38);
  if (address != (ENetAddress *)0x0) {
    memset(&local_7c,0,0x1c);
    local_7c = 10;
    local_7a = htons(address->port);
    sin._0_8_ = *(undefined8 *)&(address->host).__in6_u;
    sin.sin6_addr.__in6_u._0_8_ = *(undefined8 *)((long)&(address->host).__in6_u + 8);
    sin.sin6_addr.__in6_u.__u6_addr32[2] = (uint32_t)address->sin6_scope_id;
    sin._20_8_ = &local_7c;
  }
  sVar2 = sendmsg(socket,(msghdr *)((long)&sin.sin6_addr.__in6_u + 0xc),0x4000);
  if ((int)sVar2 != -1) {
    return (int)sVar2;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if (iVar1 != 4) {
    if (iVar1 == 0xb) {
      return 0;
    }
    if (iVar1 != 0x5a) {
      return -1;
    }
  }
  return -2;
}

Assistant:

int enet_socket_send(ENetSocket socket, const ENetAddress *address, const ENetBuffer *buffers, size_t bufferCount) {
        struct msghdr msgHdr;
        struct sockaddr_in6 sin;
        int sentLength;

        memset(&msgHdr, 0, sizeof(struct msghdr));

        if (address != NULL) {
            memset(&sin, 0, sizeof(struct sockaddr_in6));

            sin.sin6_family     = AF_INET6;
            sin.sin6_port       = ENET_HOST_TO_NET_16(address->port);
            sin.sin6_addr       = address->host;
            sin.sin6_scope_id   = address->sin6_scope_id;

            msgHdr.msg_name    = &sin;
            msgHdr.msg_namelen = sizeof(struct sockaddr_in6);
        }

        msgHdr.msg_iov    = (struct iovec *) buffers;
        msgHdr.msg_iovlen = bufferCount;

        sentLength = sendmsg(socket, &msgHdr, MSG_NOSIGNAL);

        if (sentLength == -1) {
            switch (errno)
            {
                case EWOULDBLOCK:
                    return 0;
                case EINTR:
                case EMSGSIZE:
                    return -2;
                default:
                    return -1;
            }

            return -1;
        }

        return sentLength;
    }